

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::handle_vline
          (Fl_Text_Display *this,int mode,int lineStartPos,int lineLen,int leftChar,int rightChar,
          int Y,int bottomClip,int leftClip,int rightClip)

{
  char c;
  uint uVar1;
  int iVar2;
  double dVar3;
  int local_88;
  int local_84;
  int di_1;
  int xAbs_1;
  int tab_1;
  int w;
  int di;
  int xAbs;
  int tab;
  int w_1;
  int len;
  char prevChar;
  char currChar;
  char *lineStr;
  uint local_40;
  int charStyle;
  int style;
  int startIndex;
  int startX;
  int X;
  int i;
  int rightChar_local;
  int leftChar_local;
  int lineLen_local;
  int lineStartPos_local;
  int mode_local;
  Fl_Text_Display *this_local;
  
  if (lineStartPos == -1) {
    _len = (char *)0x0;
  }
  else {
    _len = Fl_Text_Buffer::text_range(this->mBuffer,lineStartPos,lineStartPos + lineLen);
  }
  lineLen_local = mode;
  if (mode == 3) {
    startIndex = 0;
  }
  else if (mode == 2) {
    startIndex = 0;
    lineLen_local = 1;
  }
  else {
    startIndex = (this->text_area).x - this->mHorizOffset;
  }
  style = startIndex;
  charStyle = 0;
  if (_len == (char *)0x0) {
    if (lineLen_local == 0) {
      uVar1 = position_style(this,lineStartPos,lineLen,-1);
      draw_string(this,uVar1 | 0x1000,(this->text_area).x,Y,
                  (this->text_area).x + (this->text_area).w,(char *)0x0,lineLen);
    }
    this_local._4_4_ = lineStartPos;
    if (lineLen_local != 1) {
      this_local._4_4_ = 0;
    }
  }
  else {
    w_1._3_1_ = '\0';
    local_40 = position_style(this,lineStartPos,lineLen,0);
    for (startX = 0; startX < lineLen; startX = tab + startX) {
      c = _len[startX];
      tab = fl_utf8len1(c);
      if (tab < 1) {
        tab = 1;
      }
      uVar1 = position_style(this,lineStartPos,lineLen,startX);
      if (((uVar1 != local_40) || (c == '\t')) || (w_1._3_1_ == '\t')) {
        if (w_1._3_1_ == '\t') {
          iVar2 = Fl_Text_Buffer::tab_distance(this->mBuffer);
          dVar3 = col_to_x(this,(double)iVar2);
          if (lineLen_local == 3) {
            local_84 = style;
          }
          else {
            local_84 = (style + this->mHorizOffset) - (this->text_area).x;
          }
          xAbs = (local_84 / (int)dVar3 + 1) * (int)dVar3 - local_84;
          if (lineLen_local == 0) {
            draw_string(this,local_40 | 0x1000,style,Y,style + xAbs,(char *)0x0,0);
          }
          if ((lineLen_local == 1) && (rightClip < style + xAbs)) {
            free(_len);
            return lineStartPos + charStyle;
          }
        }
        else {
          dVar3 = string_width(this,_len + charStyle,startX - charStyle,local_40);
          xAbs = (int)dVar3;
          if (lineLen_local == 0) {
            draw_string(this,local_40,style,Y,style + xAbs,_len + charStyle,startX - charStyle);
          }
          if ((lineLen_local == 1) && (rightClip < style + xAbs)) {
            iVar2 = find_x(this,_len + charStyle,startX - charStyle,local_40,rightClip - style);
            free(_len);
            return lineStartPos + charStyle + iVar2;
          }
        }
        style = xAbs + style;
        charStyle = startX;
        local_40 = uVar1;
      }
      w_1._3_1_ = c;
    }
    if (w_1._3_1_ == '\t') {
      iVar2 = Fl_Text_Buffer::tab_distance(this->mBuffer);
      dVar3 = col_to_x(this,(double)iVar2);
      if (lineLen_local == 3) {
        local_88 = style;
      }
      else {
        local_88 = (style + this->mHorizOffset) - (this->text_area).x;
      }
      xAbs_1 = (local_88 / (int)dVar3 + 1) * (int)dVar3 - local_88;
      if (lineLen_local == 0) {
        draw_string(this,local_40 | 0x1000,style,Y,style + xAbs_1,(char *)0x0,0);
      }
      if (lineLen_local == 1) {
        free(_len);
        return lineStartPos + charStyle + (uint)(xAbs_1 < rightClip - style);
      }
    }
    else {
      dVar3 = string_width(this,_len + charStyle,startX - charStyle,local_40);
      xAbs_1 = (int)dVar3;
      if (lineLen_local == 0) {
        draw_string(this,local_40,style,Y,style + xAbs_1,_len + charStyle,startX - charStyle);
      }
      if (lineLen_local == 1) {
        iVar2 = find_x(this,_len + charStyle,startX - charStyle,local_40,rightClip - style);
        free(_len);
        return lineStartPos + charStyle + iVar2;
      }
    }
    if (lineLen_local == 3) {
      free(_len);
      this_local._4_4_ = style + xAbs_1;
    }
    else {
      uVar1 = position_style(this,lineStartPos,lineLen,startX);
      if (lineLen_local == 0) {
        draw_string(this,uVar1 | 0x1000,xAbs_1 + style,Y,(this->text_area).x + (this->text_area).w,
                    _len,lineLen);
      }
      free(_len);
      this_local._4_4_ = lineStartPos + lineLen;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::handle_vline(
                                  int mode,
                                  int lineStartPos, int lineLen, int leftChar, int rightChar,
                                  int Y, int bottomClip,
                                  int leftClip, int rightClip) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  // FIXME: we need to allow two modes for FIND_INDEX: one on the edge of the
  // FIXME: character for selection, and one on the character center for cursors.
  int i, X, startX, startIndex, style, charStyle;
  char *lineStr;

  if ( lineStartPos == -1 ) {
    lineStr = NULL;
  } else {
    lineStr = mBuffer->text_range( lineStartPos, lineStartPos + lineLen );
  }

  if (mode==GET_WIDTH) {
    X = 0;
  } else if (mode==FIND_INDEX_FROM_ZERO) {
    X = 0;
    mode = FIND_INDEX;
  } else {
    X = text_area.x - mHorizOffset;
  }

  startX = X;
  startIndex = 0;
  if (!lineStr) {
    // just clear the background
    if (mode==DRAW_LINE) {
      style = position_style(lineStartPos, lineLen, -1);
      draw_string( style|BG_ONLY_MASK, text_area.x, Y, text_area.x+text_area.w, lineStr, lineLen );
    }
    if (mode==FIND_INDEX) {
      IS_UTF8_ALIGNED2(buffer(), lineStartPos)
      return lineStartPos;
    }
    return 0;
  }

  char currChar = 0, prevChar = 0;
  // draw the line
  style = position_style(lineStartPos, lineLen, 0);
  for (i=0; i<lineLen; ) {
    currChar = lineStr[i]; // one byte is enough to handele tabs and other cases
    int len = fl_utf8len1(currChar);
    if (len<=0) len = 1; // OUCH!
    charStyle = position_style(lineStartPos, lineLen, i);
    if (charStyle!=style || currChar=='\t' || prevChar=='\t') {
      // draw a segment whenever the style changes or a Tab is found
      int w = 0;
      if (prevChar=='\t') {
        // draw a single Tab space
        int tab = (int)col_to_x(mBuffer->tab_distance());
        int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
        w = (((xAbs/tab)+1)*tab) - xAbs;
        if (mode==DRAW_LINE)
          draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          free(lineStr);
          return lineStartPos + startIndex;
        }
      } else {
        // draw a text segment
        w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
        if (mode==DRAW_LINE)
          draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
          free(lineStr);
          IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
          return lineStartPos + startIndex + di;
        }
      }
      style = charStyle;
      startX += w;
      startIndex = i;
    }
    i += len;
    prevChar = currChar;
  }
  int w = 0;
  if (currChar=='\t') {
    // draw a single Tab space
    int tab = (int)col_to_x(mBuffer->tab_distance());
    int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
    w = (((xAbs/tab)+1)*tab) - xAbs;
    if (mode==DRAW_LINE)
      draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      free(lineStr);
      return lineStartPos + startIndex + ( rightClip-startX>w ? 1 : 0 );
    }
  } else {
    w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
    if (mode==DRAW_LINE)
      draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
      free(lineStr);
      IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
      return lineStartPos + startIndex + di;
    }
  }
  if (mode==GET_WIDTH) {
    free(lineStr);
    return startX+w;
  }

  // clear the rest of the line
  startX += w;
  style = position_style(lineStartPos, lineLen, i);
  if (mode==DRAW_LINE)
    draw_string( style|BG_ONLY_MASK, startX, Y, text_area.x+text_area.w, lineStr, lineLen );

  free(lineStr);
  IS_UTF8_ALIGNED2(buffer(), (lineStartPos+lineLen))
  return lineStartPos + lineLen;
}